

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O2

int tcp_server(char *host,unsigned_short port)

{
  int __fd;
  int iVar1;
  hostent *phVar2;
  char *__s;
  sockaddr local_2c;
  int opt;
  
  __fd = socket(2,1,0);
  if (__fd < 0) {
    __s = "init socket";
  }
  else {
    local_2c.sa_data[10] = '\0';
    local_2c.sa_data[0xb] = '\0';
    local_2c.sa_data[0xc] = '\0';
    local_2c.sa_data[0xd] = '\0';
    local_2c.sa_data[2] = '\0';
    local_2c.sa_data[3] = '\0';
    local_2c.sa_data[4] = '\0';
    local_2c.sa_data[5] = '\0';
    local_2c.sa_data[6] = '\0';
    local_2c.sa_data[7] = '\0';
    local_2c.sa_data[8] = '\0';
    local_2c.sa_data[9] = '\0';
    local_2c.sa_family = 2;
    local_2c.sa_data._0_2_ = port << 8 | port >> 8;
    if (host != (char *)0x0) {
      iVar1 = inet_pton(2,host,local_2c.sa_data + 2);
      if (iVar1 == 0) {
        phVar2 = gethostbyname(host);
        if (phVar2 == (hostent *)0x0) {
          __s = "get host name";
          goto LAB_001069ac;
        }
        local_2c.sa_data._2_4_ = *(undefined4 *)*phVar2->h_addr_list;
      }
    }
    opt = 1;
    setsockopt(__fd,1,2,&opt,4);
    iVar1 = bind(__fd,&local_2c,0x10);
    if (iVar1 != -1) {
      listen(__fd,0x400);
      return __fd;
    }
    close(__fd);
    __s = "bind sockfd wit addr";
  }
LAB_001069ac:
  perror(__s);
  exit(1);
}

Assistant:

int tcp_server(const char *host, unsigned short port) {
  int sockfd = -1;
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (sockfd < 0) {
    ERR_EXIT("init socket");
  }

  struct sockaddr_in sa_in;
  bzero(&sa_in, sizeof(sa_in));
  sa_in.sin_family = AF_INET;
  sa_in.sin_port = htons(port);
  if (host != NULL) {
    if (inet_pton(AF_INET, host, &sa_in.sin_addr) == 0) {
      //可能为主机地址
      struct hostent *hp;
      hp = gethostbyname(host);
      if (hp == NULL) {
        ERR_EXIT("get host name");
      }
      sa_in.sin_addr = *((struct in_addr *) hp->h_addr);
    }
  } else {
    sa_in.sin_addr.s_addr = htonl(INADDR_ANY);
  }

  int opt = 1;
  setsockopt(sockfd, SOL_SOCKET, SO_REUSEADDR, &opt, sizeof(opt));

  if (bind(sockfd, (struct sockaddr *) &sa_in, sizeof(sa_in)) == -1) {
    close(sockfd);
    ERR_EXIT("bind sockfd wit addr");
  }

  listen(sockfd, LISTENQ);

  return sockfd;
}